

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

ssize_t recv(int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  uint *puVar4;
  int _set_errno;
  ssize_t readret;
  int pollret;
  pollfd pf;
  int timeout;
  rpchook_t *lp;
  int flags_local;
  size_t length_local;
  void *buffer_local;
  ssize_t sStack_10;
  int socket_local;
  
  if (g_sys_recv_func == (recv_pfn_t)0x0) {
    g_sys_recv_func = (recv_pfn_t)dlsym(0xffffffffffffffff);
  }
  bVar2 = co_is_enable_sys_hook();
  if (bVar2) {
    register0x00000000 = get_by_fd(__fd);
    if ((register0x00000000 == (rpchook_t *)0x0) || ((register0x00000000->user_flag & 0x800U) != 0))
    {
      sStack_10 = (*g_sys_recv_func)(__fd,__buf,__n,__flags);
    }
    else {
      pf.fd = (int)(register0x00000000->read_timeout).tv_sec * 1000 +
              (int)((register0x00000000->read_timeout).tv_usec / 1000);
      memset((void *)((long)&readret + 4),0,8);
      pollret._0_2_ = 0x19;
      readret._4_4_ = __fd;
      readret._0_4_ = poll((pollfd *)((long)&readret + 4),1,pf.fd);
      sStack_10 = (*g_sys_recv_func)(__fd,__buf,__n,__flags);
      if (sStack_10 < 0) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        puVar4 = (uint *)__errno_location();
        co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",(ulong)(uint)__fd,
                   sStack_10,(ulong)*puVar4,(ulong)(uint)readret,(ulong)(uint)pf.fd);
        piVar3 = __errno_location();
        *piVar3 = iVar1;
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          piVar3 = __errno_location();
          *piVar3 = 0x7c5;
        }
      }
    }
  }
  else {
    sStack_10 = (*g_sys_recv_func)(__fd,__buf,__n,__flags);
  }
  return sStack_10;
}

Assistant:

ssize_t recv( int socket, void *buffer, size_t length, int flags )
{
	HOOK_SYS_FUNC( recv );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_recv_func( socket,buffer,length,flags );
	}
	rpchook_t *lp = get_by_fd( socket );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) ) 
	{
		return g_sys_recv_func( socket,buffer,length,flags );
	}
	int timeout = ( lp->read_timeout.tv_sec * 1000 ) 
				+ ( lp->read_timeout.tv_usec / 1000 );

	struct pollfd pf = { 0 };
	pf.fd = socket;
	pf.events = ( POLLIN | POLLERR | POLLHUP );

	int pollret = poll( &pf,1,timeout );

	ssize_t readret = g_sys_recv_func( socket,buffer,length,flags );

	if( readret < 0 )
	{
		int _set_errno = errno;
		co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",
					socket,readret,errno,pollret,timeout);
		errno = _set_errno;
		if(errno == EAGAIN){
			errno = LIBCO_POLL_TIMEOUT;
		}

	}

	return readret;
	
}